

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_filter.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::InFilter::ToExpression(InFilter *this,Expression *column)

{
  Value *pVVar1;
  pointer pBVar2;
  long *in_RDX;
  Value *args;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  Expression *local_48;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> local_40;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  
  local_50._M_head_impl._0_1_ = 0x23;
  local_38._M_head_impl = (Expression *)this;
  make_uniq<duckdb::BoundOperatorExpression,duckdb::ExpressionType,duckdb::LogicalTypeId_const&>
            ((duckdb *)&local_40,(ExpressionType *)&local_50,&LogicalType::BOOLEAN);
  pBVar2 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                         *)&local_40);
  (**(code **)(*in_RDX + 0x88))(&local_50);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&pBVar2->children,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_50);
  if (local_50._M_head_impl != (Expression *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  pVVar1 = (Value *)(column->super_BaseExpression).alias._M_string_length;
  for (args = (Value *)(column->super_BaseExpression).alias._M_dataplus._M_p; args != pVVar1;
      args = args + 1) {
    pBVar2 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                           *)&local_40);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value_const&>((duckdb *)&local_48,args);
    local_50._M_head_impl = local_48;
    local_48 = (Expression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar2->children,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_50);
    if (local_50._M_head_impl != (Expression *)0x0) {
      (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_50._M_head_impl = (Expression *)0x0;
    if (local_48 != (Expression *)0x0) {
      (*(local_48->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  ((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
       (_func_int **)local_40._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         local_38._M_head_impl;
}

Assistant:

unique_ptr<Expression> InFilter::ToExpression(const Expression &column) const {
	auto result = make_uniq<BoundOperatorExpression>(ExpressionType::COMPARE_IN, LogicalType::BOOLEAN);
	result->children.push_back(column.Copy());
	for (auto &val : values) {
		result->children.push_back(make_uniq<BoundConstantExpression>(val));
	}
	return std::move(result);
}